

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.h
# Opt level: O0

void __thiscall re2::SparseArray<int>::create_index(SparseArray<int> *this,int i)

{
  bool bVar1;
  reference pvVar2;
  int i_local;
  SparseArray<int> *this_local;
  
  bVar1 = has_index(this,i);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!has_index(i)",
                  "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                  ,0x1a8,"void re2::SparseArray<int>::create_index(int) [Value = int]");
  }
  if (this->size_ < this->max_size_) {
    this->sparse_to_dense_[i] = this->size_;
    pvVar2 = std::
             vector<re2::SparseArray<int>::IndexValue,_std::allocator<re2::SparseArray<int>::IndexValue>_>
             ::operator[](&this->dense_,(long)this->size_);
    pvVar2->index_ = i;
    this->size_ = this->size_ + 1;
    return;
  }
  __assert_fail("(size_) < (max_size_)",
                "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/util/sparse_array.h"
                ,0x1a9,"void re2::SparseArray<int>::create_index(int) [Value = int]");
}

Assistant:

void SparseArray<Value>::create_index(int i) {
  DCHECK(!has_index(i));
  DCHECK_LT(size_, max_size_);
  sparse_to_dense_[i] = size_;
  dense_[size_].index_ = i;
  size_++;
}